

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O1

int metaIndex(lua_State *L)

{
  uint uVar1;
  Arena<Variable> *this;
  dll_lua_pushnumber p_Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  Variable *pVVar6;
  string *psVar7;
  code *pcVar8;
  dll_lua_pushstring p_Var9;
  Idx<Variable> id;
  Idx<Variable> id_00;
  Idx<Variable> id_01;
  Idx<Variable> id_02;
  string k;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar4 = (uint *)(*lua_touserdata)(L,1);
  uVar1 = *puVar4;
  this = *(Arena<Variable> **)(puVar4 + 2);
  pcVar5 = (*lua_tolstring)(L,2,(size_t *)0x0);
  std::__cxx11::string::string((string *)local_40,pcVar5,&local_41);
  iVar3 = std::__cxx11::string::compare((char *)local_40);
  p_Var9 = lua_pushstring;
  if (iVar3 == 0) {
    id._4_4_ = 0;
    id.Raw = uVar1;
    id._arena = this;
    pVVar6 = Arena<Variable>::Index(this,id);
    psVar7 = &pVVar6->name;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_40);
    p_Var9 = lua_pushstring;
    if (iVar3 == 0) {
      id_00._4_4_ = 0;
      id_00.Raw = uVar1;
      id_00._arena = this;
      pVVar6 = Arena<Variable>::Index(this,id_00);
      psVar7 = &pVVar6->value;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_40);
      p_Var2 = lua_pushnumber;
      if (iVar3 == 0) {
        id_01._4_4_ = 0;
        id_01.Raw = uVar1;
        id_01._arena = this;
        pVVar6 = Arena<Variable>::Index(this,id_01);
        (*p_Var2)(L,(double)pVVar6->valueType);
        goto LAB_001304fe;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_40);
      p_Var9 = lua_pushstring;
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)local_40);
        if (iVar3 == 0) {
          pcVar8 = metaAddChild;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_40);
          if (iVar3 != 0) {
            (*lua_pushnil)(L);
            goto LAB_001304fe;
          }
          pcVar8 = metaQuery;
        }
        (*lua_pushcclosure)(L,pcVar8,0);
        goto LAB_001304fe;
      }
      id_02._4_4_ = 0;
      id_02.Raw = uVar1;
      id_02._arena = this;
      pVVar6 = Arena<Variable>::Index(this,id_02);
      psVar7 = &pVVar6->valueTypeName;
    }
  }
  (*p_Var9)(L,(psVar7->_M_dataplus)._M_p);
LAB_001304fe:
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return 1;
}

Assistant:

int metaIndex(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto var = *pVar;
	const std::string k = lua_tostring(L, 2);
	if (k == "name")
	{
		lua_pushstring(L, var->name.c_str());
	}
	else if (k == "value")
	{
		lua_pushstring(L, var->value.c_str());
	}
	else if (k == "valueType")
	{
		lua_pushnumber(L, var->valueType);
	}
	else if (k == "valueTypeName")
	{
		lua_pushstring(L, var->valueTypeName.c_str());
	}
	else if (k == "addChild")
	{
		lua_pushcfunction(L, metaAddChild);
	}
	else if (k == "query")
	{
		lua_pushcfunction(L, metaQuery);
	}
	else
	{
		lua_pushnil(L);
	}
	return 1;
}